

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

TapBranch * cfd::core::TapBranch::FromString(TapBranch *__return_storage_ptr__,string *text)

{
  bool bVar1;
  long lVar2;
  CfdException *this;
  reference pvVar3;
  undefined1 local_1d0 [8];
  TapBranch branch2;
  TapBranch branch1;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text_list;
  allocator local_39;
  string local_38;
  string *local_18;
  string *text_local;
  TapBranch *result;
  
  local_18 = text;
  text_local = (string *)__return_storage_ptr__;
  lVar2 = ::std::__cxx11::string::find((char)text,0x20);
  if (lVar2 != -1) {
    text_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"Contains invalid charactor.",&local_39);
    CfdException::CfdException(this,kCfdIllegalArgumentError,&local_38);
    text_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  text_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  TapBranch(__return_storage_ptr__);
  FromString(std::__cxx11::string_const&)::$_0::operator()::string_const___const
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,&FromString(std::__cxx11::string_const&)::collect_items_func,local_18);
  bVar1 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
  if (bVar1) {
    FromString::anon_class_1_0_00000001::operator()
              ((TapBranch *)
               &branch1.branch_list_.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (anon_class_1_0_00000001 *)&FromString(std::__cxx11::string_const&)::analyze_func,
               local_18);
    operator=(__return_storage_ptr__,
              (TapBranch *)
              &branch1.branch_list_.
               super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    ~TapBranch((TapBranch *)
               &branch1.branch_list_.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    pvVar3 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,0);
    FromString::anon_class_1_0_00000001::operator()
              ((TapBranch *)
               &branch2.branch_list_.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (anon_class_1_0_00000001 *)&FromString(std::__cxx11::string_const&)::analyze_func,
               pvVar3);
    pvVar3 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,1);
    FromString::anon_class_1_0_00000001::operator()
              ((TapBranch *)local_1d0,
               (anon_class_1_0_00000001 *)&FromString(std::__cxx11::string_const&)::analyze_func,
               pvVar3);
    if ((((byte)branch1._vptr_TapBranch & 1) == 0) && (((byte)branch2._vptr_TapBranch & 1) != 0)) {
      AddBranch((TapBranch *)local_1d0,
                (TapBranch *)
                &branch2.branch_list_.
                 super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      operator=(__return_storage_ptr__,(TapBranch *)local_1d0);
    }
    else {
      AddBranch((TapBranch *)
                &branch2.branch_list_.
                 super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,(TapBranch *)local_1d0);
      operator=(__return_storage_ptr__,
                (TapBranch *)
                &branch2.branch_list_.
                 super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    ~TapBranch((TapBranch *)local_1d0);
    ~TapBranch((TapBranch *)
               &branch2.branch_list_.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  text_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  if ((text_list.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) == 0) {
    ~TapBranch(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

TapBranch TapBranch::FromString(const std::string& text) {
  static auto check_tapleaf_func = [](const std::string& text,
                                      TapBranch* branch) -> bool {
    if (text.size() < 6) return false;
    std::string head = text.substr(0, 3);
    if ((head == "tl(") && (*(text.end() - 1) == ')')) {
      size_t leaf_ver_offset = text.find(',');
      if (leaf_ver_offset == std::string::npos) {
        *branch = TaprootScriptTree(Script(text.substr(3, text.length() - 4)));
      } else {
        auto script_str = text.substr(3, leaf_ver_offset - 3);
        auto leaf_ver_str = text.substr(leaf_ver_offset + 1, 2);
        char* err = nullptr;
        auto leaf_version = strtol(leaf_ver_str.c_str(), &err, 16);
        if (((err != nullptr) && (*err != '\0')) || (leaf_version < 0) ||
            (leaf_version > std::numeric_limits<uint8_t>::max())) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid leaf version.");
        }
        *branch = TaprootScriptTree(
            static_cast<uint8_t>(leaf_version), Script(script_str));
      }
      return true;
    }
    return false;
  };

  static auto analyze_func = [](const std::string& target) -> TapBranch {
    TapBranch result;
    if (*target.begin() == '{') {
      result = TapBranch::FromString(target);  // analyze branch
    } else if (!check_tapleaf_func(target, &result)) {
      result = TapBranch(ByteData256(target));
    }
    return result;
  };

  static auto collect_items_func =
      [](const std::string& text) -> std::vector<std::string> {
    std::vector<std::string> result;
    uint8_t depth = 0;
    size_t start_block_index = 0;
    size_t end_block_index = 0;
    size_t split_index = 0;
    for (size_t idx = 0; idx < text.size(); ++idx) {
      const char& str = text[idx];
      if (str == '{') {
        if (depth == 0) start_block_index = idx + 1;
        ++depth;
        if (depth == std::numeric_limits<uint8_t>::max()) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
      } else if (str == '}') {
        if (depth == 0) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
        --depth;
        if (depth == 0) {
          if (split_index == 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree format. empty split block.");
          }
          end_block_index = idx;
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if (end_block_index <= offset) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError, "Invalid tree item.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
        }
      } else if (str == ',') {
        if (depth == 1) {
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if ((offset + 3) < text.size()) {
            auto head = text.substr(offset, 3);
            char prev_str = 0;
            if (idx > 0) prev_str = text[idx - 1];
            // ignore leaf ver
            if ((head == "tl(") && (prev_str != ')')) continue;
          }

          if (split_index != 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree splitformat.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
          split_index = idx + 1;
        }
      }
    }

    if (result.empty()) {
      // do nothing
    } else if ((result.size() != 2) || ((end_block_index + 1) < text.size())) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
    }
    return result;
  };

  if (text.find(' ') != std::string::npos) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Contains invalid charactor.");
  }

  TapBranch result;
  auto text_list = collect_items_func(text);
  if (text_list.empty()) {
    result = analyze_func(text);
  } else {
    auto branch1 = analyze_func(text_list.at(0));
    auto branch2 = analyze_func(text_list.at(1));
    if ((!branch1.has_leaf_) && (branch2.has_leaf_)) {
      branch2.AddBranch(branch1);
      result = branch2;
    } else {
      branch1.AddBranch(branch2);
      result = branch1;
    }
  }

  return result;
}